

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distorm.c
# Opt level: O3

void distorm_format_size(uchar **str,_DInst *di,int opNum)

{
  ushort uVar1;
  undefined8 uVar2;
  long lVar3;
  
  if ((opNum < 2) && (((opNum != 0 || (di->ops[0].type == '\x01')) || (di->ops[1].type == '\x01'))))
  {
    uVar1 = di->opcode;
    if (uVar1 < 0x3c7) {
      if (((0x3f < uVar1 - 0x36c) ||
          ((0x8008000000010001U >> ((ulong)(uVar1 - 0x36c) & 0x3f) & 1) == 0)) &&
         ((uVar1 != 0x7b && (uVar1 != 0x80)))) {
        return;
      }
    }
    else if (((0x23 < uVar1 - 0x3c7) || ((0x842108421U >> ((ulong)(uVar1 - 0x3c7) & 0x3f) & 1) == 0)
             ) && ((uVar1 != 0x272b && (uVar1 != 0x9df)))) {
      return;
    }
  }
  uVar1 = di->ops[(uint)opNum].size >> 3;
  uVar2 = 0x2020202044524f57;
  lVar3 = 5;
  switch(uVar1) {
  case 1:
    uVar2 = 0x2020202045545942;
    break;
  case 2:
    break;
  case 3:
  case 5:
  case 6:
  case 7:
  case 9:
    goto switchD_00103531_caseD_3;
  case 4:
    lVar3 = 6;
    uVar2 = 0x20202044524f5744;
    break;
  case 8:
    uVar2 = 0x20202044524f5751;
LAB_00103574:
    lVar3 = 6;
    break;
  case 10:
    lVar3 = 6;
    uVar2 = 0x2020204554594254;
    break;
  default:
    if (uVar1 != 0x10) {
      if (uVar1 != 0x20) {
        return;
      }
      uVar2 = 0x20202044524f5759;
      goto LAB_00103574;
    }
    lVar3 = 7;
    uVar2 = 0x202044524f575144;
  }
  *(undefined8 *)*str = uVar2;
  *str = *str + lVar3;
switchD_00103531_caseD_3:
  return;
}

Assistant:

static void distorm_format_size(unsigned char** str, const _DInst* di, int opNum)
{
	int isSizingRequired = 0;
	/*
	 * We only have to output the size explicitly if it's not clear from the operands.
	 * For example:
	 * mov al, [0x1234] -> The size is 8, we know it from the AL register operand.
	 * mov [0x1234], 0x11 -> Now we don't know the size. Pam pam pam
	 *
	 * If given operand number is higher than 2, then output the size anyways.
	 */
	isSizingRequired = ((opNum >= 2) || ((opNum == 0) && (di->ops[0].type != O_REG) && (di->ops[1].type != O_REG)));

	/* Still not sure? Try some special instructions. */
	if (!isSizingRequired) {
		/*
		 * INS/OUTS are exception, because DX is a port specifier and not a real src/dst register.
		 * A few exceptions that always requires sizing:
		 * MOVZX, MOVSX, MOVSXD.
		 * ROL, ROR, RCL, RCR, SHL, SHR, SAL, SAR.
		 * SHLD, SHRD.
		 * CVTSI2SS is also an exception.
		 */
		switch (di->opcode)
		{
			case I_INS:
			case I_OUTS:
			case I_MOVZX:
			case I_MOVSX:
			case I_MOVSXD:
			case I_ROL:
			case I_ROR:
			case I_RCL:
			case I_RCR:
			case I_SHL:
			case I_SHR:
			case I_SAL:
			case I_SAR:
			case I_SHLD:
			case I_SHRD:
			case I_CVTSI2SS:
				isSizingRequired = 1;
			break;
			default: /* Instruction doesn't require sizing. */ break;
		}
	}

	if (isSizingRequired)
	{
		/*case 0: break; OT_MEM's unknown size. */
		switch (di->ops[opNum].size / 8)
		{
			case 1: strcat_WS(*str,  "BYTE    ", 8, 5); break;
			case 2: strcat_WS(*str,  "WORD    ", 8, 5); break;
			case 4: strcat_WS(*str,  "DWORD   ", 8, 6); break;
			case 8: strcat_WS(*str,  "QWORD   ", 8, 6); break;
			case 10: strcat_WS(*str, "TBYTE   ", 8, 6); break;
			case 16: strcat_WS(*str, "DQWORD  ", 8, 7); break;
			case 32: strcat_WS(*str, "YWORD   ", 8, 6); break;
		}
	}
}